

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

int __thiscall
ncnn::Mat::clone(Mat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  int i;
  size_t size;
  Mat *m;
  Mat *m_1;
  Mat *m_2;
  size_t in_stack_fffffffffffffc78;
  Allocator *in_stack_fffffffffffffc80;
  int _d;
  size_t in_stack_fffffffffffffc88;
  int _w;
  void **ppvVar2;
  Mat *in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  int _w_00;
  Mat *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffcf0;
  Allocator *in_stack_fffffffffffffd00;
  void *local_2d0;
  int *local_2c8;
  ulong local_2c0;
  undefined4 local_2b8;
  long *local_2b0;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  ulong local_290;
  void *local_288;
  int *local_280;
  ulong local_278;
  int local_270;
  Allocator *local_268;
  int local_260;
  int local_25c;
  int local_258;
  undefined4 local_254;
  int local_250;
  ulong local_248;
  int local_23c;
  size_t local_238;
  undefined1 local_219;
  void *local_218;
  __fn *local_210;
  Mat *local_208;
  __fn *local_200;
  Mat *local_1f0;
  __fn *local_1e8;
  __fn *local_1e0;
  __fn *local_1d8;
  undefined1 local_1cd;
  int local_1cc;
  Mat *local_1c8;
  void **local_1c0;
  void **local_1b8;
  undefined1 local_1ad;
  int local_1ac;
  __fn *local_1a8;
  void **local_1a0;
  void **local_198;
  void **local_180;
  void **local_170;
  int local_120;
  undefined4 local_11c;
  void **local_118;
  int local_100;
  undefined4 local_fc;
  void **local_f8;
  long *local_d0;
  undefined4 local_c4;
  ulong local_c0;
  void *local_b8;
  undefined4 local_ac;
  int local_a8;
  int local_a4;
  void **local_a0;
  undefined4 local_94;
  long local_90;
  Allocator *local_88;
  int local_7c;
  ulong local_78;
  void *local_70;
  int local_64;
  int local_60;
  int local_5c;
  void **local_58;
  undefined4 local_4c;
  long local_48;
  void *local_30;
  void *local_20;
  
  bVar1 = true;
  if (*(long *)__fn != 0) {
    bVar1 = *(long *)(__fn + 0x40) * (long)*(int *)(__fn + 0x38) == 0;
    local_1e8 = __fn;
  }
  if (bVar1) {
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    this->elemsize = 0;
    this->elempack = 0;
    this->allocator = (Allocator *)0x0;
    this->dims = 0;
    this->w = 0;
    this->h = 0;
    this->d = 0;
    this->c = 0;
    this->cstep = 0;
  }
  else {
    local_219 = 0;
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    this->elemsize = 0;
    this->elempack = 0;
    this->allocator = (Allocator *)0x0;
    this->dims = 0;
    this->w = 0;
    this->h = 0;
    this->d = 0;
    this->c = 0;
    this->cstep = 0;
    _w = (int)(in_stack_fffffffffffffc88 >> 0x20);
    _w_00 = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
    local_218 = __child_stack;
    local_210 = __fn;
    local_208 = this;
    local_200 = __fn;
    local_1f0 = this;
    if (*(int *)(__fn + 0x28) == 1) {
      create(in_stack_fffffffffffffca0,_w_00,(size_t)in_stack_fffffffffffffc90,_w,
             in_stack_fffffffffffffc80);
    }
    else if (*(int *)(__fn + 0x28) == 2) {
      create(in_stack_fffffffffffffca0,_w_00,(int)in_stack_fffffffffffffc98,
             (size_t)in_stack_fffffffffffffc90,_w,in_stack_fffffffffffffc80);
    }
    else {
      _d = (int)((ulong)in_stack_fffffffffffffc80 >> 0x20);
      if (*(int *)(__fn + 0x28) == 3) {
        create(in_stack_fffffffffffffca0,_w_00,(int)in_stack_fffffffffffffc98,
               (int)((ulong)in_stack_fffffffffffffc90 >> 0x20),in_stack_fffffffffffffc88,_d,
               in_stack_fffffffffffffd00);
      }
      else if (*(int *)(__fn + 0x28) == 4) {
        create(in_stack_fffffffffffffc90,_w,(int)in_stack_fffffffffffffc88,_d,
               (int)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffcf0,
               (Allocator *)this);
      }
    }
    if (*(long *)(__fn + 0x40) * (long)*(int *)(__fn + 0x38) != 0) {
      local_1d8 = __fn;
      if (*(size_t *)(__fn + 0x40) == this->cstep) {
        local_1e0 = __fn;
        memcpy(this->data,*(void **)__fn,
               *(long *)(__fn + 0x40) * (long)*(int *)(__fn + 0x38) * *(long *)(__fn + 0x10));
      }
      else {
        local_238 = (long)*(int *)(__fn + 0x2c) * (long)*(int *)(__fn + 0x30) *
                    (long)*(int *)(__fn + 0x34) * *(long *)(__fn + 0x10);
        for (local_23c = 0; local_23c < *(int *)(__fn + 0x38); local_23c = local_23c + 1) {
          local_1c0 = &local_288;
          local_5c = this->w;
          local_60 = this->h;
          local_64 = this->d;
          local_70 = (void *)((long)this->data + this->cstep * (long)local_23c * this->elemsize);
          local_78 = this->elemsize;
          local_7c = this->elempack;
          local_88 = this->allocator;
          local_58 = &local_288;
          local_280 = (int *)0x0;
          local_254 = 1;
          local_48 = (long)local_5c * (long)local_60 * local_78;
          local_248 = (local_48 + 0xfU & 0xfffffffffffffff0) / local_78;
          local_260 = this->dims + -1;
          if (this->dims == 4) {
            local_248 = (long)this->w * (long)this->h;
          }
          local_1b8 = &local_288;
          local_1a0 = &local_2d0;
          local_a4 = *(int *)(__fn + 0x2c);
          local_a8 = *(int *)(__fn + 0x30);
          local_ac = *(undefined4 *)(__fn + 0x34);
          local_b8 = (void *)(*(long *)__fn +
                             *(long *)(__fn + 0x40) * (long)local_23c * *(long *)(__fn + 0x10));
          local_c0 = *(ulong *)(__fn + 0x10);
          local_c4 = *(undefined4 *)(__fn + 0x18);
          local_d0 = *(long **)(__fn + 0x20);
          local_a0 = &local_2d0;
          local_2c8 = (int *)0x0;
          local_29c = 1;
          local_90 = (long)local_a4 * (long)local_a8 * local_c0;
          local_290 = (local_90 + 0xfU & 0xfffffffffffffff0) / local_c0;
          local_2a8 = *(int *)(__fn + 0x28) + -1;
          if (*(int *)(__fn + 0x28) == 4) {
            local_290 = (long)*(int *)(__fn + 0x2c) * (long)*(int *)(__fn + 0x30);
          }
          local_4c = 0x10;
          local_94 = 0x10;
          local_1ac = local_23c;
          local_1ad = 1;
          local_1cc = local_23c;
          local_1cd = 1;
          local_198 = &local_2d0;
          local_1c8 = this;
          local_1a8 = __fn;
          local_2d0 = local_b8;
          local_2c0 = local_c0;
          local_2b8 = local_c4;
          local_2b0 = local_d0;
          local_2a4 = local_a4;
          local_2a0 = local_a8;
          local_298 = local_ac;
          local_288 = local_70;
          local_278 = local_78;
          local_270 = local_7c;
          local_268 = local_88;
          local_25c = local_5c;
          local_258 = local_60;
          local_250 = local_64;
          memcpy(local_70,local_b8,local_238);
          ppvVar2 = &local_2d0;
          local_180 = ppvVar2;
          local_f8 = ppvVar2;
          if (local_2c8 != (int *)0x0) {
            local_fc = 0xffffffff;
            LOCK();
            local_100 = *local_2c8;
            *local_2c8 = *local_2c8 + -1;
            UNLOCK();
            if (local_100 == 1) {
              if (local_2b0 == (long *)0x0) {
                local_30 = local_2d0;
                if (local_2d0 != (void *)0x0) {
                  free(local_2d0);
                }
              }
              else {
                (**(code **)(*local_2b0 + 0x18))(local_2b0,local_2d0);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          ppvVar2[2] = (void *)0x0;
          *(undefined4 *)(ppvVar2 + 3) = 0;
          *(undefined4 *)(ppvVar2 + 5) = 0;
          *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
          *(undefined4 *)(ppvVar2 + 6) = 0;
          *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
          *(undefined4 *)(ppvVar2 + 7) = 0;
          ppvVar2[8] = (void *)0x0;
          ppvVar2[1] = (void *)0x0;
          ppvVar2 = &local_288;
          local_170 = ppvVar2;
          local_118 = ppvVar2;
          if (local_280 != (int *)0x0) {
            local_11c = 0xffffffff;
            LOCK();
            local_120 = *local_280;
            *local_280 = *local_280 + -1;
            UNLOCK();
            if (local_120 == 1) {
              if (local_268 == (Allocator *)0x0) {
                local_20 = local_288;
                if (local_288 != (void *)0x0) {
                  free(local_288);
                }
              }
              else {
                (*local_268->_vptr_Allocator[3])(local_268,local_288);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          ppvVar2[2] = (void *)0x0;
          *(undefined4 *)(ppvVar2 + 3) = 0;
          *(undefined4 *)(ppvVar2 + 5) = 0;
          *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
          *(undefined4 *)(ppvVar2 + 6) = 0;
          *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
          *(undefined4 *)(ppvVar2 + 7) = 0;
          ppvVar2[8] = (void *)0x0;
          ppvVar2[1] = (void *)0x0;
        }
      }
    }
  }
  return (int)this;
}

Assistant:

Mat Mat::clone(Allocator* _allocator) const
{
    if (empty())
        return Mat();

    Mat m;
    if (dims == 1)
        m.create(w, elemsize, elempack, _allocator);
    else if (dims == 2)
        m.create(w, h, elemsize, elempack, _allocator);
    else if (dims == 3)
        m.create(w, h, c, elemsize, elempack, _allocator);
    else if (dims == 4)
        m.create(w, h, d, c, elemsize, elempack, _allocator);

    if (total() > 0)
    {
        if (cstep == m.cstep)
            memcpy(m.data, data, total() * elemsize);
        else
        {
            // copy by channel for differnet cstep
            size_t size = (size_t)w * h * d * elemsize;
            for (int i = 0; i < c; i++)
            {
                memcpy(m.channel(i), channel(i), size);
            }
        }
    }

    return m;
}